

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O2

void __thiscall QByteArray::QByteArray(QByteArray *this,qsizetype size,Initialization param_2)

{
  long in_FS_OFFSET;
  pair<QTypedArrayData<char>_*,_char_*> local_38;
  qsizetype local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (this->d).d = (Data *)0x0;
  (this->d).ptr = (char *)0x0;
  (this->d).size = 0;
  if (size < 1) {
    local_38 = (pair<QTypedArrayData<char>_*,_char_*>)(ZEXT816(0x13216c) << 0x40);
    local_28 = 0;
    QArrayDataPointer<char>::operator=(&this->d,(QArrayDataPointer<char> *)&local_38);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_38);
  }
  else {
    local_38 = QTypedArrayData<char>::allocate(size,KeepSize);
    local_28 = size;
    QArrayDataPointer<char>::operator=(&this->d,(QArrayDataPointer<char> *)&local_38);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_38);
    (this->d).ptr[size] = '\0';
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray::QByteArray(qsizetype size, Qt::Initialization)
{
    if (size <= 0) {
        d = DataPointer::fromRawData(&_empty, 0);
    } else {
        d = DataPointer(size, size);
        Q_CHECK_PTR(d.data());
        d.data()[size] = '\0';
    }
}